

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazePrototypeFactory.cpp
# Opt level: O2

void __thiscall
MazePrototypeFactory::MazePrototypeFactory
          (MazePrototypeFactory *this,Maze *m,Wall *w,Room *r,Door *d)

{
  MazeFactory::MazeFactory(&this->super_MazeFactory);
  *(undefined ***)this = &PTR_MakeMaze_00103d80;
  this->_prototypeMaze = m;
  this->_prototypeWall = w;
  this->_prototypeRoom = r;
  this->_prototypeDoor = d;
  return;
}

Assistant:

MazePrototypeFactory::MazePrototypeFactory (
    Maze* m, Wall* w, Room* r, Door* d
) {
   _prototypeMaze = m;
   _prototypeWall = w;
   _prototypeRoom = r;
   _prototypeDoor = d;
}